

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::B3DImporter::ReadBB3D(B3DImporter *this,aiScene *scene)

{
  pointer pVVar1;
  aiNode *paVar2;
  __uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_> _Var3;
  pointer puVar4;
  aiAnimation *paVar5;
  undefined1 auVar6 [16];
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  pointer pvVar21;
  bool bVar22;
  uint uVar23;
  Logger *this_00;
  pointer puVar24;
  pointer ppaVar25;
  ulong uVar26;
  undefined8 *__s;
  undefined8 *__s_00;
  aiBone *paVar27;
  aiVertexWeight *paVar28;
  aiMatrix4x4t<float> *paVar29;
  aiBone **ppaVar30;
  aiMaterial *this_01;
  pointer puVar31;
  aiMaterial **ppaVar32;
  aiMesh **ppaVar33;
  aiNodeAnim **ppaVar34;
  aiAnimation **ppaVar35;
  pointer ppaVar36;
  pointer puVar37;
  ulong uVar38;
  undefined8 *__s_01;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *v;
  int iVar39;
  size_t i;
  ulong uVar40;
  ulong uVar41;
  B3DImporter *pBVar42;
  long lVar43;
  long lVar44;
  aiNode *paVar45;
  float fVar46;
  float fVar47;
  long local_210;
  aiBone *bone;
  vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
  *local_1f8;
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  *local_1f0;
  aiScene *local_1e8;
  long local_1e0;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  vweights;
  MakeLeftHandedProcess makeleft;
  FlipWindingOrderProcess flip;
  undefined1 local_90 [64];
  string t;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->_textures);
  local_1f8 = (vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
               *)&this->_materials;
  std::
  vector<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
  ::clear((vector<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
           *)local_1f8);
  pVVar1 = (this->_vertices).
           super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_vertices).
      super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->_vertices).
    super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  local_1f0 = &this->_meshes;
  std::
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ::clear(local_1f0);
  DeleteAllBarePointers<aiNode*>(&this->_nodes);
  ppaVar25 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar25) {
    (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar25;
  }
  std::
  vector<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
  ::clear(&this->_nodeAnims);
  std::
  vector<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
  ::clear(&this->_animations);
  ReadChunk_abi_cxx11_(&t,this);
  bVar22 = std::operator==(&t,"BB3D");
  if (bVar22) {
    uVar23 = ReadInt(this);
    bVar22 = DefaultLogger::isNullLogger();
    if (!bVar22) {
      snprintf((char *)&makeleft,0x80,"B3D file format version: %i",(ulong)uVar23);
      this_00 = DefaultLogger::get();
      Logger::info(this_00,(char *)&makeleft);
    }
    while( true ) {
      puVar24 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar23 = puVar24[-1];
      if (uVar23 == this->_pos) break;
      ReadChunk_abi_cxx11_((string *)&makeleft,this);
      bVar22 = std::operator==((string *)&makeleft,"TEXS");
      if (bVar22) {
        ReadTEXS(this);
      }
      else {
        bVar22 = std::operator==((string *)&makeleft,"BRUS");
        if (bVar22) {
          ReadBRUS(this);
        }
        else {
          bVar22 = std::operator==((string *)&makeleft,"NODE");
          if (bVar22) {
            ReadNODE(this,(aiNode *)0x0);
          }
        }
      }
      puVar24 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      this->_pos = puVar24[-1];
      (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar24 + -1;
      std::__cxx11::string::~string((string *)&makeleft);
    }
  }
  else {
    puVar24 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish;
    uVar23 = puVar24[-1];
  }
  this->_pos = uVar23;
  (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar24 + -1;
  ppaVar25 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppaVar36 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppaVar36 == ppaVar25) {
    pBVar42 = (B3DImporter *)(local_90 + 0x20);
    std::__cxx11::string::string((string *)pBVar42,"No nodes",(allocator *)&makeleft);
    Fail(pBVar42,(string *)(local_90 + 0x20));
  }
  if ((this->_meshes).
      super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_meshes).
      super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pBVar42 = (B3DImporter *)local_90;
    std::__cxx11::string::string((string *)pBVar42,"No meshes",(allocator *)&makeleft);
    Fail(pBVar42,(string *)local_90);
  }
  uVar38 = 0;
  local_1e8 = scene;
  do {
    if ((ulong)((long)ppaVar36 - (long)ppaVar25 >> 3) <= uVar38) {
      scene->mRootNode = *ppaVar25;
      ppaVar25 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppaVar25) {
        (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppaVar25;
      }
      puVar37 = (this->_materials).
                super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar31 = (this->_materials).
                super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar31 == puVar37) {
        this_01 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_01);
        makeleft.super_BaseProcess._vptr_BaseProcess = (_func_int **)this_01;
        std::
        vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
        ::emplace_back<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>
                  (local_1f8,(unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&makeleft);
        std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr
                  ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&makeleft);
        puVar37 = (this->_materials).
                  super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar31 = (this->_materials).
                  super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      scene->mNumMaterials = (uint)((ulong)((long)puVar31 - (long)puVar37) >> 3);
      ppaVar32 = unique_to_array<aiMaterial>
                           ((vector<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                             *)local_1f8);
      scene->mMaterials = ppaVar32;
      scene->mNumMeshes =
           (uint)((ulong)((long)(this->_meshes).
                                super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->_meshes).
                               super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
      ppaVar33 = unique_to_array<aiMesh>(local_1f0);
      scene->mMeshes = ppaVar33;
      puVar4 = (this->_animations).
               super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (((long)puVar4 -
           (long)(this->_animations).
                 super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 8) &&
         (uVar38 = (long)(this->_nodeAnims).
                         super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_nodeAnims).
                         super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, uVar38 != 0)) {
        paVar5 = puVar4[-1]._M_t.
                 super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
                 super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                 super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl;
        paVar5->mNumChannels = (uint)(uVar38 >> 3);
        ppaVar34 = unique_to_array<aiNodeAnim>(&this->_nodeAnims);
        paVar5->mChannels = ppaVar34;
        scene->mNumAnimations =
             (uint)((ulong)((long)(this->_animations).
                                  super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_animations).
                                 super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
        ppaVar35 = unique_to_array<aiAnimation>(&this->_animations);
        scene->mAnimations = ppaVar35;
      }
      MakeLeftHandedProcess::MakeLeftHandedProcess(&makeleft);
      MakeLeftHandedProcess::Execute(&makeleft,scene);
      FlipWindingOrderProcess::FlipWindingOrderProcess(&flip);
      FlipWindingOrderProcess::Execute(&flip,scene);
      FlipWindingOrderProcess::~FlipWindingOrderProcess(&flip);
      MakeLeftHandedProcess::~MakeLeftHandedProcess(&makeleft);
      std::__cxx11::string::~string((string *)&t);
      return;
    }
    paVar2 = ppaVar25[uVar38];
    for (uVar41 = 0; uVar41 < paVar2->mNumMeshes; uVar41 = uVar41 + 1) {
      _Var3._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
           (local_1f0->
           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[paVar2->mMeshes[uVar41]]._M_t.
           super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t;
      iVar39 = *(int *)((long)_Var3._M_t.
                              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8);
      iVar7 = iVar39 * 3;
      *(int *)((long)_Var3._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                     super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 4) = iVar7;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (long)iVar7;
      uVar26 = SUB168(auVar6 * ZEXT816(0xc),0);
      uVar40 = uVar26;
      if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
        uVar40 = 0xffffffffffffffff;
      }
      __s = (undefined8 *)operator_new__(uVar40);
      if (iVar39 != 0) {
        memset(__s,0,((uVar26 - 0xc) - (uVar26 - 0xc) % 0xc) + 0xc);
      }
      *(undefined8 **)
       ((long)_Var3._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x10) = __s;
      if ((this->_vflags & 1) == 0) {
        __s_01 = (undefined8 *)0x0;
      }
      else {
        __s_01 = (undefined8 *)operator_new__(uVar40);
        if (iVar39 != 0) {
          memset(__s_01,0,((uVar26 - 0xc) - (uVar26 - 0xc) % 0xc) + 0xc);
        }
        *(undefined8 **)
         ((long)_Var3._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x18) = __s_01;
      }
      if (this->_tcsets == 0) {
        __s_00 = (undefined8 *)0x0;
      }
      else {
        __s_00 = (undefined8 *)operator_new__(uVar40);
        if (iVar39 != 0) {
          memset(__s_00,0,((uVar26 - 0xc) - (uVar26 - 0xc) % 0xc) + 0xc);
        }
        *(undefined8 **)
         ((long)_Var3._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x70) = __s_00;
      }
      local_210 = *(long *)((long)_Var3._M_t.
                                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0);
      std::
      vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
      ::vector(&vweights,
               (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,(allocator_type *)&makeleft);
      lVar43 = 0;
      while (lVar43 < iVar7) {
        local_1e0 = lVar43;
        for (lVar44 = 0; lVar44 != 3; lVar44 = lVar44 + 1) {
          uVar40 = (ulong)*(uint *)(*(long *)(local_210 + 8) + lVar44 * 4);
          pVVar1 = (this->_vertices).
                   super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(float *)(__s + 1) = pVVar1[uVar40].vertex.z;
          *__s = *(undefined8 *)&pVVar1[uVar40].vertex;
          if (__s_01 == (undefined8 *)0x0) {
            __s_01 = (undefined8 *)0x0;
          }
          else {
            *(float *)(__s_01 + 1) = pVVar1[uVar40].normal.z;
            *__s_01 = *(undefined8 *)&pVVar1[uVar40].normal;
            __s_01 = (undefined8 *)((long)__s_01 + 0xc);
          }
          if (__s_00 == (undefined8 *)0x0) {
            __s_00 = (undefined8 *)0x0;
          }
          else {
            *(float *)(__s_00 + 1) = pVVar1[uVar40].texcoords.z;
            *__s_00 = *(undefined8 *)&pVVar1[uVar40].texcoords;
            __s_00 = (undefined8 *)((long)__s_00 + 0xc);
          }
          __s = (undefined8 *)((long)__s + 0xc);
          iVar39 = (int)lVar44 + (int)local_1e0;
          *(int *)(*(long *)(local_210 + 8) + lVar44 * 4) = iVar39;
          for (lVar43 = -4; lVar43 != 0; lVar43 = lVar43 + 1) {
            fVar46 = *(float *)(pVVar1[uVar40 + 1].bones + lVar43 * 4 + -0x24);
            if ((fVar46 == 0.0) && (!NAN(fVar46))) break;
            makeleft.super_BaseProcess._vptr_BaseProcess = (_func_int **)CONCAT44(fVar46,iVar39);
            std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
            emplace_back<aiVertexWeight>
                      (vweights.
                       super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       *(byte *)((long)pVVar1[uVar40].weights + lVar43),(aiVertexWeight *)&makeleft)
            ;
          }
        }
        local_210 = local_210 + 0x10;
        lVar43 = local_1e0 + 3;
      }
      bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uVar40 = 0;
      scene = local_1e8;
      while( true ) {
        pvVar21 = vweights.
                  super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)vweights.
                           super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vweights.
                          super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar40) break;
        if (vweights.
            super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar40].
            super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            vweights.
            super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar40].
            super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
            super__Vector_impl_data._M_start) {
          paVar27 = (aiBone *)operator_new(0x450);
          aiBone::aiBone(paVar27);
          bone = paVar27;
          std::vector<aiBone_*,_std::allocator<aiBone_*>_>::push_back(&bones,&bone);
          paVar27 = bone;
          paVar45 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar40];
          if ((aiNode *)bone != paVar45) {
            uVar23 = (paVar45->mName).length;
            (bone->mName).length = uVar23;
            memcpy((bone->mName).data,(paVar45->mName).data,(ulong)uVar23);
            (paVar27->mName).data[uVar23] = '\0';
          }
          v = pvVar21 + uVar40;
          bone->mNumWeights =
               (uint)((ulong)((long)(v->
                                    super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(v->
                                   super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 3);
          paVar28 = to_array<aiVertexWeight>(this,v);
          bone->mWeights = paVar28;
          fVar46 = (paVar45->mTransformation).a1;
          fVar47 = (paVar45->mTransformation).a2;
          makeleft.super_BaseProcess.shared._0_4_ = (paVar45->mTransformation).a3;
          makeleft.super_BaseProcess.shared._4_4_ = (paVar45->mTransformation).a4;
          makeleft.super_BaseProcess.progress._0_4_ = (paVar45->mTransformation).b1;
          makeleft.super_BaseProcess.progress._4_4_ = (paVar45->mTransformation).b2;
          while( true ) {
            makeleft.super_BaseProcess._vptr_BaseProcess = (_func_int **)CONCAT44(fVar47,fVar46);
            paVar45 = paVar45->mParent;
            if (paVar45 == (aiNode *)0x0) break;
            flip.super_BaseProcess._vptr_BaseProcess = *(_func_int ***)&paVar45->mTransformation;
            flip.super_BaseProcess.shared =
                 *(SharedPostProcessInfo **)&(paVar45->mTransformation).a3;
            flip.super_BaseProcess.progress = *(ProgressHandler **)&(paVar45->mTransformation).b1;
            aiMatrix4x4t<float>::operator*=
                      ((aiMatrix4x4t<float> *)&flip,(aiMatrix4x4t<float> *)&makeleft);
            fVar46 = flip.super_BaseProcess._vptr_BaseProcess._0_4_;
            fVar47 = flip.super_BaseProcess._vptr_BaseProcess._4_4_;
            makeleft.super_BaseProcess.shared._0_4_ = flip.super_BaseProcess.shared._0_4_;
            makeleft.super_BaseProcess.shared._4_4_ = flip.super_BaseProcess.shared._4_4_;
            makeleft.super_BaseProcess.progress._0_4_ = flip.super_BaseProcess.progress._0_4_;
            makeleft.super_BaseProcess.progress._4_4_ = flip.super_BaseProcess.progress._4_4_;
          }
          paVar29 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&makeleft);
          fVar17 = paVar29->a1;
          fVar18 = paVar29->a2;
          fVar19 = paVar29->a3;
          fVar20 = paVar29->a4;
          fVar13 = paVar29->b1;
          fVar14 = paVar29->b2;
          fVar15 = paVar29->b3;
          fVar16 = paVar29->b4;
          fVar9 = paVar29->c1;
          fVar10 = paVar29->c2;
          fVar11 = paVar29->c3;
          fVar12 = paVar29->c4;
          fVar46 = paVar29->d2;
          fVar47 = paVar29->d3;
          fVar8 = paVar29->d4;
          (bone->mOffsetMatrix).d1 = paVar29->d1;
          (bone->mOffsetMatrix).d2 = fVar46;
          (bone->mOffsetMatrix).d3 = fVar47;
          (bone->mOffsetMatrix).d4 = fVar8;
          (bone->mOffsetMatrix).c1 = fVar9;
          (bone->mOffsetMatrix).c2 = fVar10;
          (bone->mOffsetMatrix).c3 = fVar11;
          (bone->mOffsetMatrix).c4 = fVar12;
          (bone->mOffsetMatrix).b1 = fVar13;
          (bone->mOffsetMatrix).b2 = fVar14;
          (bone->mOffsetMatrix).b3 = fVar15;
          (bone->mOffsetMatrix).b4 = fVar16;
          (bone->mOffsetMatrix).a1 = fVar17;
          (bone->mOffsetMatrix).a2 = fVar18;
          (bone->mOffsetMatrix).a3 = fVar19;
          (bone->mOffsetMatrix).a4 = fVar20;
          scene = local_1e8;
        }
        uVar40 = uVar40 + 1;
      }
      *(int *)((long)_Var3._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                     super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd8) =
           (int)((ulong)((long)bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
      ppaVar30 = to_array<aiBone*>(this,(vector<aiBone_*,_std::allocator<aiBone_*>_> *)
                                        &bones.
                                         super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>);
      *(aiBone ***)
       ((long)_Var3._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe0) = ppaVar30;
      std::_Vector_base<aiBone_*,_std::allocator<aiBone_*>_>::~_Vector_base
                (&bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>);
      std::
      vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
      ::~vector(&vweights);
    }
    uVar38 = uVar38 + 1;
    ppaVar25 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppaVar36 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

void B3DImporter::ReadBB3D( aiScene *scene ){

    _textures.clear();

    _materials.clear();

    _vertices.clear();

    _meshes.clear();

    DeleteAllBarePointers(_nodes);
    _nodes.clear();

    _nodeAnims.clear();

    _animations.clear();

    string t=ReadChunk();
    if( t=="BB3D" ){
        int version=ReadInt();

        if (!DefaultLogger::isNullLogger()) {
            char dmp[128];
            ai_snprintf(dmp, 128, "B3D file format version: %i",version);
            ASSIMP_LOG_INFO(dmp);
        }

        while( ChunkSize() ){
            string t=ReadChunk();
            if( t=="TEXS" ){
                ReadTEXS();
            }else if( t=="BRUS" ){
                ReadBRUS();
            }else if( t=="NODE" ){
                ReadNODE( 0 );
            }
            ExitChunk();
        }
    }
    ExitChunk();

    if( !_nodes.size() ) Fail( "No nodes" );

    if( !_meshes.size() ) Fail( "No meshes" );

    //Fix nodes/meshes/bones
    for(size_t i=0;i<_nodes.size();++i ){
        aiNode *node=_nodes[i];

        for( size_t j=0;j<node->mNumMeshes;++j ){
            aiMesh *mesh = _meshes[node->mMeshes[j]].get();

            int n_tris=mesh->mNumFaces;
            int n_verts=mesh->mNumVertices=n_tris * 3;

            aiVector3D *mv=mesh->mVertices=new aiVector3D[ n_verts ],*mn=0,*mc=0;
            if( _vflags & 1 ) mn=mesh->mNormals=new aiVector3D[ n_verts ];
            if( _tcsets ) mc=mesh->mTextureCoords[0]=new aiVector3D[ n_verts ];

            aiFace *face=mesh->mFaces;

            vector< vector<aiVertexWeight> > vweights( _nodes.size() );

            for( int i=0;i<n_verts;i+=3 ){
                for( int j=0;j<3;++j ){
                    Vertex &v=_vertices[face->mIndices[j]];

                    *mv++=v.vertex;
                    if( mn ) *mn++=v.normal;
                    if( mc ) *mc++=v.texcoords;

                    face->mIndices[j]=i+j;

                    for( int k=0;k<4;++k ){
                        if( !v.weights[k] ) break;

                        int bone=v.bones[k];
                        float weight=v.weights[k];

                        vweights[bone].push_back( aiVertexWeight(i+j,weight) );
                    }
                }
                ++face;
            }

            vector<aiBone*> bones;
            for(size_t i=0;i<vweights.size();++i ){
                vector<aiVertexWeight> &weights=vweights[i];
                if( !weights.size() ) continue;

                aiBone *bone=new aiBone;
                bones.push_back( bone );

                aiNode *bnode=_nodes[i];

                bone->mName=bnode->mName;
                bone->mNumWeights= static_cast<unsigned int>(weights.size());
                bone->mWeights=to_array( weights );

                aiMatrix4x4 mat=bnode->mTransformation;
                while( bnode->mParent ){
                    bnode=bnode->mParent;
                    mat=bnode->mTransformation * mat;
                }
                bone->mOffsetMatrix=mat.Inverse();
            }
            mesh->mNumBones= static_cast<unsigned int>(bones.size());
            mesh->mBones=to_array( bones );
        }
    }

    //nodes
    scene->mRootNode=_nodes[0];
    _nodes.clear();  // node ownership now belongs to scene

    //material
    if( !_materials.size() ){
        _materials.emplace_back( std::unique_ptr<aiMaterial>(new aiMaterial) );
    }
    scene->mNumMaterials= static_cast<unsigned int>(_materials.size());
    scene->mMaterials = unique_to_array( _materials );

    //meshes
    scene->mNumMeshes= static_cast<unsigned int>(_meshes.size());
    scene->mMeshes = unique_to_array( _meshes );

    //animations
    if( _animations.size()==1 && _nodeAnims.size() ){

        aiAnimation *anim = _animations.back().get();
        anim->mNumChannels=static_cast<unsigned int>(_nodeAnims.size());
        anim->mChannels = unique_to_array( _nodeAnims );

        scene->mNumAnimations=static_cast<unsigned int>(_animations.size());
        scene->mAnimations=unique_to_array( _animations );
    }

    // convert to RH
    MakeLeftHandedProcess makeleft;
    makeleft.Execute( scene );

    FlipWindingOrderProcess flip;
    flip.Execute( scene );
}